

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O1

void SimpleString::padStringsToSameLength(SimpleString *str1,SimpleString *str2,char padCharacter)

{
  char *pcVar1;
  char cVar2;
  char *pcVar3;
  long lVar4;
  char *pcVar5;
  size_t repeatCount;
  SimpleString *this;
  size_t n;
  ulong uVar6;
  size_t n_1;
  ulong uVar7;
  char local_3a [2];
  SimpleString local_38;
  SimpleString local_28;
  
  do {
    this = str1;
    str1 = str2;
    pcVar5 = this->buffer_;
    uVar6 = 0xffffffffffffffff;
    do {
      lVar4 = uVar6 + 1;
      uVar6 = uVar6 + 1;
    } while (pcVar5[lVar4] != '\0');
    pcVar3 = str1->buffer_;
    uVar7 = 0xffffffffffffffff;
    do {
      lVar4 = uVar7 + 1;
      uVar7 = uVar7 + 1;
    } while (pcVar3[lVar4] != '\0');
    str2 = this;
  } while (uVar7 < uVar6);
  local_3a[1] = 0;
  repeatCount = 0;
  do {
    pcVar1 = pcVar3 + repeatCount;
    repeatCount = repeatCount + 1;
  } while (*pcVar1 != '\0');
  do {
    repeatCount = repeatCount - 1;
    cVar2 = *pcVar5;
    pcVar5 = pcVar5 + 1;
  } while (cVar2 != '\0');
  local_3a[0] = padCharacter;
  SimpleString(&local_28,local_3a,repeatCount);
  operator+(&local_38,&local_28);
  if (&local_38 != this) {
    copyBufferToNewInternalBuffer(this,&local_38);
  }
  deallocateInternalBuffer(&local_38);
  deallocateInternalBuffer(&local_28);
  return;
}

Assistant:

void SimpleString::padStringsToSameLength(SimpleString& str1, SimpleString& str2, char padCharacter)
{
    if (str1.size() > str2.size()) {
        padStringsToSameLength(str2, str1, padCharacter);
        return;
    }

    char pad[2];
    pad[0] = padCharacter;
    pad[1] = 0;
    str1 = SimpleString(pad, str2.size() - str1.size()) + str1;
}